

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void __thiscall TCMallocTest_NAllocX_Test::TestBody(TCMallocTest_NAllocX_Test *this)

{
  char cVar1;
  TestingPortal *pTVar2;
  void *__ptr;
  long *plVar3;
  ulong uVar4;
  char *pcVar5;
  unsigned_long local_60;
  size_t rounded;
  AssertHelper local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  pTVar2 = tcmalloc::TestingPortal::Get();
  cVar1 = (**(code **)(*(long *)pTVar2 + 8))(pTVar2);
  if (cVar1 == '\0') {
    rounded = 0;
    do {
      local_60 = nallocx(rounded,0);
      testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
                (local_48,"rounded","size",&local_60,&rounded);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_40->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x4b7,pcVar5);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
LAB_001105dd:
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_38._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_38._M_head_impl + 8))();
        }
        if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          return;
        }
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,local_40);
        return;
      }
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,local_40);
      }
      __ptr = malloc(rounded);
      plVar3 = (long *)MallocExtension::instance();
      local_38._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (**(code **)(*plVar3 + 0xb0))(plVar3,__ptr);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_48,"rounded","MallocExtension::instance()->GetAllocatedSize(ptr)",&local_60,
                 (unsigned_long *)&local_38);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_40->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x4b9,pcVar5);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
        goto LAB_001105dd;
      }
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,local_40);
      }
      free(__ptr);
      if (rounded < 0x400) {
        rounded = rounded + 7;
      }
      else {
        uVar4 = rounded >> 8 | rounded >> 7;
        uVar4 = uVar4 >> 2 | uVar4;
        uVar4 = uVar4 >> 4 | uVar4;
        uVar4 = uVar4 >> 8 | uVar4;
        rounded = rounded + (uVar4 >> 0x10 | uVar4) + 1;
      }
    } while (rounded < 0x100001);
  }
  return;
}

Assistant:

TEST(TCMallocTest, NAllocX) {
  if (TestingPortal::Get()->IsDebuggingMalloc()) {
    return;
  }

  for (size_t size = 0; size <= (1 << 20); size = GrowNallocxTestSize(size)) {
    size_t rounded = nallocx(size, 0);
    ASSERT_GE(rounded, size);
    void* ptr = malloc(size);
    ASSERT_EQ(rounded, MallocExtension::instance()->GetAllocatedSize(ptr));
    free(ptr);
  }
}